

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O0

unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
 __thiscall Storage::Tape::MSX::Parser::find_header(Parser *this,BinaryTapePlayer *tape_player)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  element_type *peVar5;
  float *pfVar6;
  IntType IVar7;
  IntType IVar8;
  pointer pFVar9;
  float fVar10;
  undefined1 local_80 [7];
  uint8_t int_result;
  undefined1 local_70 [20];
  float local_5c;
  undefined1 local_58 [4];
  float total_length;
  float local_48 [2];
  float next_length;
  undefined1 local_38 [20];
  float local_24;
  int samples;
  float high;
  float low;
  bool last_level;
  BinaryTapePlayer *tape_player_local;
  __single_object *result;
  
  _low = tape_player;
  tape_player_local = (BinaryTapePlayer *)this;
  bVar1 = BinaryTapePlayer::get_motor_control(tape_player);
  if (bVar1) {
    high._3_1_ = BinaryTapePlayer::get_input(_low);
    samples = (int)std::numeric_limits<float>::max();
    local_24 = std::numeric_limits<float>::min();
    local_38._16_4_ = 0;
    do {
      TapePlayer::get_tape((TapePlayer *)local_38);
      peVar5 = std::
               __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
      iVar3 = (**peVar5->_vptr_Tape)();
      std::shared_ptr<Storage::Tape::Tape>::~shared_ptr((shared_ptr<Storage::Tape::Tape> *)local_38)
      ;
      if ((((byte)iVar3 ^ 0xff) & 1) == 0) break;
      local_48[0] = 0.0;
      do {
        IVar7 = TimedEventLoop::get_cycles_until_next_event((TimedEventLoop *)_low);
        IVar8 = TimedEventLoop::get_input_clock_rate((TimedEventLoop *)_low);
        local_48[0] = (float)IVar7 / (float)IVar8 + local_48[0];
        TapePlayer::run_for_input_pulse(&_low->super_TapePlayer);
        bVar1 = (bool)(high._3_1_ & 1);
        bVar2 = BinaryTapePlayer::get_input(_low);
      } while (bVar1 == bVar2);
      high._3_1_ = BinaryTapePlayer::get_input(_low);
      pfVar6 = std::min<float>((float *)&samples,local_48);
      samples = (int)*pfVar6;
      pfVar6 = std::max<float>(&local_24,local_48);
      local_24 = *pfVar6;
      local_38._16_4_ = local_38._16_4_ + 1;
      if (3.5e-05 < local_24 - (float)samples) {
        samples = (int)std::numeric_limits<float>::max();
        local_24 = std::numeric_limits<float>::min();
        local_38._16_4_ = 0;
      }
    } while (local_38._16_4_ != 0x8ae);
    TapePlayer::get_tape((TapePlayer *)local_58);
    peVar5 = std::__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
    uVar4 = (**peVar5->_vptr_Tape)();
    std::shared_ptr<Storage::Tape::Tape>::~shared_ptr((shared_ptr<Storage::Tape::Tape> *)local_58);
    if ((uVar4 & 1) == 0) {
      local_5c = 0.0;
      local_38._16_4_ = 0x200;
      while( true ) {
        TapePlayer::get_tape((TapePlayer *)local_70);
        peVar5 = std::
                 __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_70);
        iVar3 = (**peVar5->_vptr_Tape)();
        std::shared_ptr<Storage::Tape::Tape>::~shared_ptr
                  ((shared_ptr<Storage::Tape::Tape> *)local_70);
        if ((((byte)iVar3 ^ 0xff) & 1) == 0) break;
        IVar7 = TimedEventLoop::get_cycles_until_next_event((TimedEventLoop *)_low);
        IVar8 = TimedEventLoop::get_input_clock_rate((TimedEventLoop *)_low);
        local_5c = (float)IVar7 / (float)IVar8 + local_5c;
        bVar1 = BinaryTapePlayer::get_input(_low);
        if (bVar1 != (bool)(high._3_1_ & 1)) {
          local_38._16_4_ = local_38._16_4_ - 1;
          if (local_38._16_4_ == 0) break;
          high._3_1_ = BinaryTapePlayer::get_input(_low);
        }
        TapePlayer::run_for_input_pulse(&_low->super_TapePlayer);
      }
      TapePlayer::get_tape((TapePlayer *)local_80);
      peVar5 = std::
               __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_80);
      uVar4 = (**peVar5->_vptr_Tape)();
      std::shared_ptr<Storage::Tape::Tape>::~shared_ptr((shared_ptr<Storage::Tape::Tape> *)local_80)
      ;
      if ((uVar4 & 1) == 0) {
        local_5c = local_5c * 0.00390625;
        fVar10 = local_5c / 8.5875e-06;
        std::make_unique<Storage::Tape::MSX::Parser::FileSpeed>();
        pFVar9 = std::
                 unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                 ::operator->((unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                               *)this);
        pFVar9->minimum_start_bit_duration = (uint8_t)(int)fVar10;
        pFVar9 = std::
                 unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                 ::operator->((unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                               *)this);
        pFVar9->low_high_disrimination_duration = (uint8_t)((int)(((int)fVar10 & 0xffU) * 3) >> 2);
      }
      else {
        std::
        unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>>
        ::unique_ptr<std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>,void>
                  ((unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>>
                    *)this,(nullptr_t)0x0);
      }
    }
    else {
      std::
      unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>>
      ::unique_ptr<std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>,void>
                ((unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>>
                  *)this,(nullptr_t)0x0);
    }
  }
  else {
    std::
    unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>>
    ::unique_ptr<std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>,void>
              ((unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>>
                *)this,(nullptr_t)0x0);
  }
  return (__uniq_ptr_data<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>,_true,_true>
          )(__uniq_ptr_data<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Parser::FileSpeed> Parser::find_header(Storage::Tape::BinaryTapePlayer &tape_player) {
	if(!tape_player.get_motor_control()) {
		return nullptr;
	}

	/*
		"When 1,111 cycles have been found with less than 35 microseconds
		variation in their lengths a header has been located."
	*/
	bool last_level = tape_player.get_input();
	float low = std::numeric_limits<float>::max();
	float high = std::numeric_limits<float>::min();
	int samples = 0;
	while(!tape_player.get_tape()->is_at_end()) {
		float next_length = 0.0f;
		do {
			next_length += float(tape_player.get_cycles_until_next_event()) / float(tape_player.get_input_clock_rate());
			tape_player.run_for_input_pulse();
		} while(last_level == tape_player.get_input());
		last_level = tape_player.get_input();
		low = std::min(low, next_length);
		high = std::max(high, next_length);
		samples++;
		if(high - low > 0.000035f) {
			low = std::numeric_limits<float>::max();
			high = std::numeric_limits<float>::min();
			samples = 0;
		}
		if(samples == 1111*2) break;	// Cycles are read, not half-cycles.
	}

	if(tape_player.get_tape()->is_at_end()) return nullptr;

	/*
		"The next 256 cycles are then read (1B34H) and averaged to determine the cassette HI cycle length."
	*/
	float total_length = 0.0f;
	samples = 512;
	while(!tape_player.get_tape()->is_at_end()) {
		total_length += float(tape_player.get_cycles_until_next_event()) / float(tape_player.get_input_clock_rate());
		if(tape_player.get_input() != last_level) {
			samples--;
			if(!samples) break;
			last_level = tape_player.get_input();
		}
		tape_player.run_for_input_pulse();
	}

	if(tape_player.get_tape()->is_at_end()) return nullptr;

	/*
		This figure is multiplied by 1.5 and placed in LOWLIM where it defines the minimum acceptable length
		of a 0 start bit. The HI cycle length is placed in WINWID and will be used to discriminate
		between LO and HI cycles."
	*/
	total_length = total_length / 256.0f;			// To get the average, in microseconds.
	// To convert to the loop count format used by the MSX BIOS.
	uint8_t int_result = uint8_t(total_length / (0.00001145f * 0.75f));

	auto result = std::make_unique<FileSpeed>();
	result->minimum_start_bit_duration = int_result;
	result->low_high_disrimination_duration = (int_result * 3) >> 2;

	return result;
}